

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall
Js::FunctionProxy::MapFunctionObjectTypes<Js::FunctionBody::RedeferFunctionObjectTypes()::__0>
          (FunctionProxy *this,anon_class_8_1_8991fb9c func)

{
  FunctionTypeWeakRefList *this_00;
  ScriptFunctionType **ppSVar1;
  FunctionTypeWeakRefList *functionObjectTypeList;
  FunctionProxy *this_local;
  anon_class_8_1_8991fb9c func_local;
  
  this_local = (FunctionProxy *)func.this;
  this_00 = GetFunctionObjectTypeList(this);
  if (this_00 != (FunctionTypeWeakRefList *)0x0) {
    JsUtil::
    List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
    ::
    Map<Js::FunctionProxy::MapFunctionObjectTypes<Js::FunctionBody::RedeferFunctionObjectTypes()::__0>(Js::FunctionBody::RedeferFunctionObjectTypes()::__0)::_lambda(int,Memory::RecyclerWeakReference<Js::ScriptFunctionType>*)_1_>
              ((List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
                *)this_00,(anon_class_8_1_8991fb9c *)&this_local);
  }
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)&this->deferredPrototypeType);
  if (*ppSVar1 != (ScriptFunctionType *)0x0) {
    ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                        ((WriteBarrierPtr *)&this->deferredPrototypeType);
    FunctionBody::RedeferFunctionObjectTypes::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&this_local,*ppSVar1);
  }
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)&this->undeferredFunctionType);
  if (*ppSVar1 != (ScriptFunctionType *)0x0) {
    ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                        ((WriteBarrierPtr *)&this->undeferredFunctionType);
    FunctionBody::RedeferFunctionObjectTypes::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&this_local,*ppSVar1);
  }
  return;
}

Assistant:

void MapFunctionObjectTypes(Fn func)
        {
            FunctionTypeWeakRefList* functionObjectTypeList = this->GetFunctionObjectTypeList();
            if (functionObjectTypeList != nullptr)
            {
                functionObjectTypeList->Map([&](int, FunctionTypeWeakRef* typeWeakRef)
                {
                    if (typeWeakRef)
                    {
                        ScriptFunctionType* type = typeWeakRef->Get();
                        if (type)
                        {
                            func(type);
                        }
                    }
                });
            }

            if (this->deferredPrototypeType)
            {
                func(this->deferredPrototypeType);
            }
            if (this->undeferredFunctionType)
            {
                func(this->undeferredFunctionType);
            }
        }